

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O1

void ary::fillPolygon(Mat *image,
                     vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *points,
                     Scalar *value)

{
  float fVar1;
  pointer pPVar2;
  pointer pPVar3;
  long lVar4;
  long lVar5;
  int mask_npoints;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> mask_points;
  Point *mask_points_ptr;
  undefined8 local_38;
  undefined4 local_30 [2];
  Mat *local_28;
  undefined8 uStack_20;
  
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
            (&mask_points,
             (long)(points->
                   super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(points->
                   super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)local_30);
  pPVar2 = (points->super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pPVar3 = (points->super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)pPVar3 - (long)pPVar2 >> 3;
  mask_npoints = (int)lVar4;
  if (pPVar3 != pPVar2) {
    lVar5 = 0;
    do {
      fVar1 = pPVar2[lVar5].y;
      mask_points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start[lVar5].x = (int)pPVar2[lVar5].x;
      mask_points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start[lVar5].y = (int)fVar1;
      lVar5 = lVar5 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
  }
  mask_points_ptr =
       mask_points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  uStack_20 = 0;
  local_30[0] = 0x3010000;
  local_38 = 0;
  local_28 = image;
  cv::fillPoly(local_30,&mask_points_ptr,&mask_npoints,1,value,8,0,&local_38);
  if (mask_points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(mask_points.
                    super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void fillPolygon(Mat& image, const vector<Point2f>& points, Scalar value) {

	vector<Point> mask_points(points.size());
	int mask_npoints = points.size();
	for (int i = 0; i < points.size(); i++) {
		mask_points[i] = Point(points[i].x, points[i].y);
	}
	const Point* mask_points_ptr = &(mask_points[0]);
	fillPoly(image, &mask_points_ptr, &mask_npoints, 1, value);

}